

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O2

void __thiscall
TPZStructMatrixOR<std::complex<double>_>::Assemble
          (TPZStructMatrixOR<std::complex<double>_> *this,TPZBaseMatrix *stiffness,
          TPZBaseMatrix *rhs,TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  int64_t newRows;
  TPZReference *pTVar1;
  long lVar2;
  long lVar3;
  TPZAutoPointer<TPZGuiInterface> *pTVar4;
  TPZAutoPointer<TPZGuiInterface> local_e0;
  TPZAutoPointer<TPZGuiInterface> local_d8;
  TPZAutoPointer<TPZGuiInterface> local_d0;
  TPZAutoPointer<TPZGuiInterface> local_c8;
  TPZFMatrix<std::complex<double>_> rhsloc;
  
  lVar2 = __dynamic_cast(this,&TPZStructMatrixOR<std::complex<double>>::typeinfo,
                         &::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  RunStatsTable::start(&ass_stiff);
  if (*(char *)(lVar2 + 0x58) == '\x01') {
    newRows = *(int64_t *)(lVar2 + 0x70);
    TPZFMatrix<std::complex<double>_>::TPZFMatrix(&rhsloc);
    lVar3 = *(long *)(*(long *)this + -0x60);
    if ((&this->field_0xc)[lVar3] == '\x01') {
      TPZFMatrix<std::complex<double>_>::Redim(&rhsloc,newRows,rhs->fCol);
      lVar3 = *(long *)(*(long *)this + -0x60);
    }
    pTVar1 = guiInterface->fRef;
    if (*(int *)(&this->field_0x8 + lVar3) == 0) {
      pTVar4 = &local_d0;
      LOCK();
      (pTVar1->fCounter).super___atomic_base<int>._M_i =
           (pTVar1->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_d0.fRef = pTVar1;
      (**(code **)(*(long *)this + 0x58))(this,stiffness,&rhsloc,pTVar4);
    }
    else {
      pTVar4 = &local_c8;
      LOCK();
      (pTVar1->fCounter).super___atomic_base<int>._M_i =
           (pTVar1->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_c8.fRef = pTVar1;
      (**(code **)(*(long *)this + 0x70))(this,stiffness,&rhsloc,pTVar4);
    }
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(pTVar4);
    if ((&this->field_0xc)[*(long *)(*(long *)this + -0x60)] == '\x01') {
      TPZEquationFilter::Scatter((TPZEquationFilter *)(lVar2 + 0x48),(TPZBaseMatrix *)&rhsloc,rhs);
    }
    TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&rhsloc);
  }
  else {
    pTVar1 = guiInterface->fRef;
    if (*(int *)(&this->field_0x8 + *(long *)(*(long *)this + -0x60)) == 0) {
      LOCK();
      (pTVar1->fCounter).super___atomic_base<int>._M_i =
           (pTVar1->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_e0.fRef = pTVar1;
      (**(code **)(*(long *)this + 0x58))(this,stiffness,rhs);
      pTVar4 = &local_e0;
    }
    else {
      LOCK();
      (pTVar1->fCounter).super___atomic_base<int>._M_i =
           (pTVar1->fCounter).super___atomic_base<int>._M_i + 1;
      UNLOCK();
      local_d8.fRef = pTVar1;
      (**(code **)(*(long *)this + 0x70))(this,stiffness,rhs);
      pTVar4 = &local_d8;
    }
    TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(pTVar4);
  }
  RunStatsTable::stop(&ass_stiff);
  return;
}

Assistant:

void 
TPZStructMatrixOR<TVar>::Assemble(TPZBaseMatrix & stiffness, TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    const auto &equationFilter =
        (dynamic_cast<TPZStructMatrix*>(this))->EquationFilter();
    ass_stiff.start();
    if (equationFilter.IsActive()) {
        int64_t neqcondense = equationFilter.NActiveEquations();
#ifdef PZDEBUG
        if (stiffness.Rows() != neqcondense) {
            DebugStop();
        }
#endif
        TPZFMatrix<TVar> rhsloc;
        if(ComputeRhs()) rhsloc.Redim(neqcondense, rhs.Cols());
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhsloc, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhsloc, guiInterface);
        }

        if(ComputeRhs()) equationFilter.Scatter(rhsloc, rhs);
    } else {
        if (this->fNumThreads) {
            this->MultiThread_Assemble(stiffness, rhs, guiInterface);
        } else {
            this->Serial_Assemble(stiffness, rhs, guiInterface);
        }
    }
    ass_stiff.stop();
}